

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::ignorableWhitespace
          (AbstractDOMParser *this,XMLCh *chars,XMLSize_t length,bool param_3)

{
  int iVar1;
  DOMNode *pDVar2;
  DOMParentNode *pDVar3;
  DOMTextImpl *node_1;
  DOMTextImpl *node;
  bool param_3_local;
  XMLSize_t length_local;
  XMLCh *chars_local;
  AbstractDOMParser *this_local;
  undefined4 extraout_var;
  
  if (((this->fWithinElement & 1U) != 0) && ((this->fIncludeIgnorableWhitespace & 1U) != 0)) {
    iVar1 = (*this->fCurrentNode->_vptr_DOMNode[4])();
    if (iVar1 == 3) {
      DOMTextImpl::appendDataFast((DOMTextImpl *)this->fCurrentNode,chars,length);
    }
    else {
      iVar1 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x23])(this,chars,length);
      pDVar2 = (DOMNode *)CONCAT44(extraout_var,iVar1);
      (*pDVar2->_vptr_DOMNode[0x3a])(pDVar2,1);
      pDVar3 = castToParentImpl(this->fCurrentParent);
      (**pDVar3->_vptr_DOMParentNode)(pDVar3,pDVar2);
      this->fCurrentNode = pDVar2;
    }
  }
  return;
}

Assistant:

void AbstractDOMParser::ignorableWhitespace(  const XMLCh* const    chars
                                            , const XMLSize_t       length
                                            , const bool)
{
    // Ignore chars before the root element
    if (!fWithinElement || !fIncludeIgnorableWhitespace)
        return;

    if (fCurrentNode->getNodeType() == DOMNode::TEXT_NODE)
    {
        DOMTextImpl *node = (DOMTextImpl *)fCurrentNode;
        node->appendDataFast(chars, length);
    }
    else
    {
        DOMTextImpl *node = (DOMTextImpl*)createText (chars, length);
        node->setIgnorableWhitespace(true);
        castToParentImpl (fCurrentParent)->appendChildFast (node);
        fCurrentNode = node;
    }
}